

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O3

int __thiscall
dit::anon_unknown_0::CommonFrameworkTests::init(CommonFrameworkTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"float_format",
             "tcu::FloatFormat_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)tcu::FloatFormat_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"either",
             "tcu::Either_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026fd78;
  pTVar1[1]._vptr_TestNode = (_func_int **)tcu::Either_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "float_format","tcu::FloatFormat_selfTest()",
								   tcu::FloatFormat_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "either","tcu::Either_selfTest()",
								   tcu::Either_selfTest));
	}